

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O3

h__Writer * __thiscall
ASDCP::PCM::MXFWriter::h__Writer::OpenWrite(h__Writer *this,string *filename,ui32_t HeaderSize)

{
  WaveAudioDescriptor *this_00;
  undefined4 in_ECX;
  undefined1 *puVar1;
  Result_t aRStack_88 [104];
  
  if (*(int *)&filename[0x1b].field_2 == 0) {
    Kumu::FileWriter::OpenWrite((string *)this);
    if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                      _vptr_TrackFileWriter) {
      *(undefined4 *)&filename[2]._M_string_length = in_ECX;
      this_00 = (WaveAudioDescriptor *)operator_new(0x1e8);
      MXF::WaveAudioDescriptor::WaveAudioDescriptor
                (this_00,(Dictionary *)filename->_M_string_length);
      *(WaveAudioDescriptor **)((long)&filename[0x18].field_2 + 8) = this_00;
      if (*(int *)&filename[0x1b].field_2 == 0) {
        *(undefined4 *)&filename[0x1b].field_2 = 1;
        puVar1 = Kumu::RESULT_OK;
      }
      else {
        puVar1 = Kumu::RESULT_STATE;
      }
      Kumu::Result_t::Result_t(aRStack_88,(Result_t *)puVar1);
      Kumu::Result_t::operator=((Result_t *)this,aRStack_88);
      Kumu::Result_t::~Result_t(aRStack_88);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize)
{
  if ( ! m_State.Test_BEGIN() )
    return RESULT_STATE;

  Result_t result = m_File.OpenWrite(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new WaveAudioDescriptor(m_Dict);
      result = m_State.Goto_INIT();
    }

  return result;
}